

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-sched.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  pointer ppgVar4;
  pointer ppgVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  time_t tVar9;
  long lVar10;
  long lVar11;
  ggml_backend_sched_t sched;
  ggml_cgraph *pgVar12;
  long lVar13;
  undefined8 uVar14;
  ulong uVar15;
  mapped_type *pmVar16;
  pointer ppgVar17;
  pointer ppgVar18;
  long lVar19;
  pointer piVar20;
  ulong uVar21;
  size_t i;
  ulong uVar22;
  int i_1;
  int32_t iVar23;
  pointer piVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  id id;
  vector<int,_std::allocator<int>_> embd;
  vector<int,_std::allocator<int>_> embd_inp;
  long local_1618;
  long local_1610;
  ulong local_1608;
  vector<float,_std::allocator<float>_> logits;
  gpt_params params;
  undefined1 local_1528 [72];
  pointer local_14e0;
  pointer pgStack_14d8;
  pointer local_14d0;
  ggml_context *local_14b8;
  pointer local_14b0;
  pointer ppgStack_14a8;
  pointer local_14a0;
  pointer ppgStack_1498;
  pointer local_1490;
  pointer ppgStack_1488;
  ggml_backend_buffer_t local_1480;
  _Rb_tree_node_base local_1468;
  size_t local_1448;
  gpt_vocab vocab;
  mt19937 rng;
  
  ggml_time_init();
  lVar8 = ggml_time_us();
  gpt_params::gpt_params(&params);
  std::__cxx11::string::assign((char *)&params.model);
  bVar6 = gpt_params_parse(argc,argv,&params);
  if (bVar6) {
    if (params.seed < 0) {
      tVar9 = time((time_t *)0x0);
      params.seed = (int32_t)tVar9;
    }
    printf("%s: seed = %d\n","main");
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed(&rng,(long)params.seed);
    if (params.prompt._M_string_length == 0) {
      gpt_random_prompt_abi_cxx11_((string *)local_1528,&rng);
      std::__cxx11::string::operator=((string *)&params.prompt,(string *)local_1528);
      std::__cxx11::string::~string((string *)local_1528);
    }
    vocab.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &vocab.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header;
    vocab.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    vocab.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    vocab.token_to_id._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    vocab.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &vocab.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header;
    vocab.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1468._M_left = &local_1468;
    local_1528._0_8_ = (pointer)0x4000000c451;
    local_1528._8_8_ = 0xc00000300;
    local_1528._16_8_ = 0x10000000c;
    vocab.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    vocab.id_to_token._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    vocab.special_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1528._24_4_ = 0x3727c5ac;
    local_14d0 = (pointer)0x0;
    local_14e0 = (pointer)0x0;
    pgStack_14d8 = (pointer)0x0;
    local_1468._M_color = _S_red;
    vocab.special_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vocab.special_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1468._M_parent = (_Base_ptr)0x0;
    local_14b0 = (pointer)0x0;
    ppgStack_14a8 = (pointer)0x0;
    local_14a0 = (pointer)0x0;
    ppgStack_1498 = (pointer)0x0;
    local_1490 = (pointer)0x0;
    ppgStack_1488 = (pointer)0x0;
    local_1448 = 0;
    local_1468._M_right = local_1468._M_left;
    vocab.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         vocab.token_to_id._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    vocab.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         vocab.id_to_token._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    lVar10 = ggml_time_us();
    bVar6 = gpt2_model_load(&params.model,(gpt2_model *)local_1528,&vocab,&params);
    if (bVar6) {
      lVar11 = ggml_time_us();
      test_gpt_tokenizer(&vocab,&params.token_test);
      sched = (ggml_backend_sched_t)
              ggml_backend_sched_new
                        (local_14b0,0,(ulong)((long)ppgStack_14a8 - (long)local_14b0) >> 3,0x1000,0)
      ;
      uVar3 = local_1528._4_4_;
      iVar23 = params.n_batch;
      if ((int)local_1528._4_4_ <= params.n_batch) {
        iVar23 = local_1528._4_4_;
      }
      embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = 0;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&logits,(long)iVar23,
                 (value_type_conflict3 *)&embd_inp,(allocator_type *)&embd);
      pgVar12 = gpt2_graph((gpt2_model *)local_1528,uVar3 - iVar23,
                           (vector<int,_std::allocator<int>_> *)&logits);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&logits);
      ggml_backend_sched_reserve(sched,pgVar12);
      lVar19 = 0;
      for (uVar22 = 0; uVar22 < (ulong)((long)ppgStack_14a8 - (long)local_14b0 >> 3);
          uVar22 = uVar22 + 1) {
        lVar13 = ggml_backend_sched_get_buffer_size(sched,local_14b0[uVar22]);
        if (lVar13 != 0) {
          uVar14 = ggml_backend_name(local_14b0[uVar22]);
          lVar19 = lVar19 + lVar13;
          auVar25._8_4_ = (int)((ulong)lVar13 >> 0x20);
          auVar25._0_8_ = lVar13;
          auVar25._12_4_ = 0x45300000;
          printf("%s: %8s compute buffer size = %8.2f MB\n",
                 SUB84(((auVar25._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0)) *
                       0.0009765625 * 0.0009765625,0),"main",uVar14);
        }
      }
      auVar26._8_4_ = (int)((ulong)lVar19 >> 0x20);
      auVar26._0_8_ = lVar19;
      auVar26._12_4_ = 0x45300000;
      printf("%s: total compute buffer size: %.2f MB\n",
             SUB84(((auVar26._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar19) - 4503599627370496.0)) * 0.0009765625 *
                   0.0009765625,0),"main");
      logits.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      logits.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      logits.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      gpt_tokenize(&embd_inp,&vocab,&params.prompt);
      iVar7 = local_1528._4_4_ -
              (int)((ulong)((long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           CONCAT44(embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._4_4_,
                                    embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._0_4_)) >> 2);
      if (params.n_predict <= iVar7) {
        iVar7 = params.n_predict;
      }
      params.n_predict = iVar7;
      printf("%s: prompt: \'%s\'\n","main",params.prompt._M_dataplus._M_p);
      printf("%s: number of tokens in prompt = %zu, first 8 tokens: ","main",
             (long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             CONCAT44(embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start._4_4_,
                      embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start._0_4_) >> 2);
      lVar19 = 0;
      while( true ) {
        iVar7 = (int)((ulong)((long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             CONCAT44(embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start._4_4_,
                                      embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      .super__Vector_impl_data._M_start._0_4_)) >> 2);
        if (7 < iVar7) {
          iVar7 = 8;
        }
        if (iVar7 <= lVar19) break;
        printf("%d ",(ulong)*(uint *)(CONCAT44(embd_inp.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start._4_4_,
                                               embd_inp.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start._0_4_) + lVar19 * 4
                                     ));
        lVar19 = lVar19 + 1;
      }
      puts("\n");
      embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_1608 = 0;
      local_1610 = 0;
      local_1618 = 0;
      iVar7 = 0;
      do {
        if ((ulong)((long)params.n_predict +
                   ((long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    CONCAT44(embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._0_4_) >> 2)) <= local_1608) break;
        if (embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish !=
            embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start) {
          lVar19 = ggml_time_us();
          gpt2_eval((gpt2_model *)local_1528,sched,iVar7,&embd,&logits);
          lVar13 = ggml_time_us();
          local_1610 = (local_1610 - lVar19) + lVar13;
        }
        fVar2 = params.temp;
        fVar1 = params.top_p;
        iVar23 = params.top_k;
        uVar22 = (long)embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
        if (uVar22 != 0) {
          embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
        }
        if (local_1608 <
            (ulong)((long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    CONCAT44(embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._0_4_) >> 2)) {
          lVar19 = local_1608 * 4;
          uVar21 = local_1608 - 1;
          piVar24 = embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            uVar21 = uVar21 + 1;
            if ((ulong)((long)embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        CONCAT44(embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start._4_4_,
                                 embd_inp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start._0_4_) >> 2) <= uVar21) {
              uVar15 = (long)piVar24 -
                       (long)embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start;
              break;
            }
            std::vector<int,_std::allocator<int>_>::push_back
                      (&embd,(value_type_conflict3 *)
                             (CONCAT44(embd_inp.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       embd_inp.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._0_4_) + lVar19));
            lVar19 = lVar19 + 4;
            uVar15 = (long)embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
            piVar24 = embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          } while ((int)(uVar15 >> 2) < params.n_batch);
          local_1608 = (local_1608 + ((long)uVar15 >> 2)) - 1;
        }
        else {
          lVar13 = (long)(int)local_1528._0_4_;
          id = 0;
          lVar19 = ggml_time_us();
          id = gpt_sample_top_k_top_p
                         (&vocab,logits.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start +
                                 (((ulong)((long)logits.
                                                 super__Vector_base<float,_std::allocator<float>_>.
                                                 _M_impl.super__Vector_impl_data._M_finish -
                                          (long)logits.
                                                super__Vector_base<float,_std::allocator<float>_>.
                                                _M_impl.super__Vector_impl_data._M_start) >> 2) -
                                 lVar13),iVar23,(double)fVar1,(double)fVar2,&rng);
          lVar13 = ggml_time_us();
          std::vector<int,_std::allocator<int>_>::push_back(&embd,&id);
          local_1618 = (local_1618 - lVar19) + lVar13;
          piVar24 = embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        iVar7 = iVar7 + (int)(uVar22 >> 2);
        for (piVar20 = embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start; piVar20 != piVar24; piVar20 = piVar20 + 1)
        {
          id = *piVar20;
          pmVar16 = std::
                    map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&vocab.id_to_token,&id);
          printf("%s",(pmVar16->_M_dataplus)._M_p);
        }
        fflush(_stdout);
        local_1608 = local_1608 + 1;
      } while (embd.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish[-1] != 0xc450);
      lVar19 = ggml_time_us();
      puts("\n");
      printf("%s:     load time = %8.2f ms\n",SUB84((double)((float)(lVar11 - lVar10) / 1000.0),0),
             "main");
      printf("%s:   sample time = %8.2f ms\n",SUB84((double)((float)local_1618 / 1000.0),0),"main");
      printf("%s:  predict time = %8.2f ms / %.2f ms per token\n",
             SUB84((double)((float)local_1610 / 1000.0),0),
             (double)(((float)local_1610 / 1000.0) / (float)iVar7),"main");
      printf("%s:    total time = %8.2f ms\n",SUB84((double)((float)(lVar19 - lVar8) / 1000.0),0),
             "main");
      ggml_free(local_14b8);
      ggml_backend_sched_free(sched);
      ggml_backend_buffer_free(local_1480);
      ppgVar5 = local_1490;
      for (ppgVar17 = ppgStack_1498; ppgVar4 = ppgStack_14a8, ppgVar18 = local_14b0,
          ppgVar17 != ppgVar5; ppgVar17 = ppgVar17 + 1) {
        ggml_backend_buffer_free(*ppgVar17);
      }
      for (; ppgVar18 != ppgVar4; ppgVar18 = ppgVar18 + 1) {
        ggml_backend_free(*ppgVar18);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&embd.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&embd_inp.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&logits.super__Vector_base<float,_std::allocator<float>_>);
      iVar7 = 0;
    }
    else {
      fprintf(_stderr,"%s: failed to load model from \'%s\'\n","main",params.model._M_dataplus._M_p)
      ;
      iVar7 = 1;
    }
    gpt2_model::~gpt2_model((gpt2_model *)local_1528);
    gpt_vocab::~gpt_vocab(&vocab);
  }
  else {
    iVar7 = 1;
  }
  gpt_params::~gpt_params(&params);
  return iVar7;
}

Assistant:

int main(int argc, char ** argv) {
    ggml_time_init();

    const int64_t t_main_start_us = ggml_time_us();

    gpt_params params;
    params.model = "models/gpt-2-117M/ggml-model.bin";

    if (gpt_params_parse(argc, argv, params) == false) {
        return 1;
    }

    if (params.seed < 0) {
        params.seed = time(NULL);
    }

    printf("%s: seed = %d\n", __func__, params.seed);

    std::mt19937 rng(params.seed);
    if (params.prompt.empty()) {
        params.prompt = gpt_random_prompt(rng);
    }

    int64_t t_load_us = 0;

    gpt_vocab vocab;
    gpt2_model model;

    // load the model
    {
        const int64_t t_start_us = ggml_time_us();

        if (!gpt2_model_load(params.model, model, vocab, params)) {
            fprintf(stderr, "%s: failed to load model from '%s'\n", __func__, params.model.c_str());
            return 1;
        }

        t_load_us = ggml_time_us() - t_start_us;

        test_gpt_tokenizer(vocab, params.token_test);
    }

    // create the backend scheduler
    // the scheduler handles the allocation of the compute buffers and the scheduling of the computation between the different backends
    ggml_backend_sched_t sched;
    {
        // initialize the scheduler
        sched = ggml_backend_sched_new(model.backends.data(), NULL, model.backends.size(), GPT2_MAX_NODES, false);

        // create the worst case graph for memory usage estimation
        int n_tokens = std::min(model.hparams.n_ctx, params.n_batch);
        int n_past = model.hparams.n_ctx - n_tokens;
        struct ggml_cgraph * gf = gpt2_graph(model, n_past, std::vector<gpt_vocab::id>(n_tokens, 0));

        ggml_backend_sched_reserve(sched, gf);


        // compute the required memory
        size_t mem_size = 0;
        for (size_t i = 0; i < model.backends.size(); i++) {
            size_t size = ggml_backend_sched_get_buffer_size(sched, model.backends[i]);
            if (size > 0) {
                mem_size += size;
                printf("%s: %8s compute buffer size = %8.2f MB\n", __func__, ggml_backend_name(model.backends[i]), size/1024.0/1024.0);
                //printf("%s: %8s compute buffer size = %zu bytes\n", __func__, ggml_backend_name(model.backends[i]), size);
            }
        }

        printf("%s: total compute buffer size: %.2f MB\n", __func__, mem_size/1024.0/1024.0);
    }

    int n_past = 0;

    int64_t t_sample_us  = 0;
    int64_t t_predict_us = 0;

    std::vector<float> logits;

    // tokenize the prompt
    std::vector<gpt_vocab::id> embd_inp = ::gpt_tokenize(vocab, params.prompt);

    params.n_predict = std::min(params.n_predict, model.hparams.n_ctx - (int) embd_inp.size());

    printf("%s: prompt: '%s'\n", __func__, params.prompt.c_str());
    printf("%s: number of tokens in prompt = %zu, first 8 tokens: ", __func__, embd_inp.size());
    for (int i = 0; i < std::min(8, (int) embd_inp.size()); i++) {
        printf("%d ", embd_inp[i]);
    }
    printf("\n\n");

    // submit the input prompt token-by-token
    // this reduces the memory usage during inference, at the cost of a bit of speed at the beginning
    std::vector<gpt_vocab::id> embd;

    for (size_t i = embd.size(); i < embd_inp.size() + params.n_predict; i++) {
        // predict
        if (embd.size() > 0) {
            const int64_t t_start_us = ggml_time_us();

            if (!gpt2_eval(model, sched, n_past, embd, logits)) {
                printf("Failed to predict\n");
                return 1;
            }

            t_predict_us += ggml_time_us() - t_start_us;
        }

        n_past += embd.size();
        embd.clear();

        if (i >= embd_inp.size()) {
            // sample next token
            const int   top_k = params.top_k;
            const float top_p = params.top_p;
            const float temp  = params.temp;

            const int n_vocab = model.hparams.n_vocab;

            gpt_vocab::id id = 0;

            {
                const int64_t t_start_sample_us = ggml_time_us();

                id = gpt_sample_top_k_top_p(vocab, logits.data() + (logits.size() - n_vocab), top_k, top_p, temp, rng);

                t_sample_us += ggml_time_us() - t_start_sample_us;
            }

            // add it to the context
            embd.push_back(id);
        } else {
            // if here, it means we are still processing the input prompt
            for (size_t k = i; k < embd_inp.size(); k++) {
                embd.push_back(embd_inp[k]);
                if (int32_t(embd.size()) >= params.n_batch) {
                    break;
                }
            }
            i += embd.size() - 1;
        }

        // display text
        for (auto id : embd) {
            printf("%s", vocab.id_to_token[id].c_str());
        }
        fflush(stdout);

        // end of text token
        if (embd.back() == 50256) {
            break;
        }
    }

    // report timing
    {
        const int64_t t_main_end_us = ggml_time_us();

        printf("\n\n");
        printf("%s:     load time = %8.2f ms\n", __func__, t_load_us/1000.0f);
        printf("%s:   sample time = %8.2f ms\n", __func__, t_sample_us/1000.0f);
        printf("%s:  predict time = %8.2f ms / %.2f ms per token\n", __func__, t_predict_us/1000.0f, t_predict_us/1000.0f/n_past);
        printf("%s:    total time = %8.2f ms\n", __func__, (t_main_end_us - t_main_start_us)/1000.0f);
    }

    ggml_free(model.ctx_w);

    ggml_backend_sched_free(sched);
    ggml_backend_buffer_free(model.buffer_kv);
    for (auto buf : model.buffers_w) {
        ggml_backend_buffer_free(buf);
    }
    for (auto backend : model.backends) {
        ggml_backend_free(backend);
    }

    return 0;
}